

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_visible_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  bool bVar1;
  longlong lVar2;
  ImRect *bb_00;
  float *pfVar3;
  longlong lVar4;
  long *in_RCX;
  int in_EDX;
  ImRect *in_RDI;
  longlong in_R8;
  longlong in_R9;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImRect grab_rect;
  ImU32 grab_col;
  ImU32 bg_col;
  float page_dir;
  float scroll_v_norm;
  int held_dir;
  float clicked_v_norm;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  ImS64 scroll_max;
  bool hovered;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  ImS64 win_size_v;
  float scrollbar_size_v;
  ImRect bb;
  bool allow_interaction;
  ImGuiStyle *style;
  float alpha;
  float bb_frame_height;
  float bb_frame_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  ImGuiInputFlags in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint uVar10;
  float fVar11;
  undefined4 in_stack_ffffffffffffff10;
  ImGuiID in_stack_ffffffffffffff14;
  ImRect *in_stack_ffffffffffffff18;
  float local_a0;
  ImGuiButtonFlags in_stack_ffffffffffffff64;
  bool *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  byte bVar12;
  byte bVar13;
  ImVec2 local_74;
  ImRect local_6c;
  byte local_59;
  ImGuiStyle *local_58;
  float local_4c;
  float local_48;
  float local_44;
  ImGuiWindow *local_40;
  ImGuiContext *local_38;
  longlong local_30;
  longlong local_28;
  long *local_20;
  int local_18;
  ImRect *local_10;
  bool local_1;
  
  local_38 = GImGui;
  local_40 = GImGui->CurrentWindow;
  if ((local_40->SkipItems & 1U) == 0) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_EDX;
    local_10 = in_RDI;
    local_44 = ImRect::GetWidth(in_RDI);
    local_48 = ImRect::GetHeight(local_10);
    if ((local_44 <= 0.0) || (local_48 <= 0.0)) {
      local_1 = false;
    }
    else {
      local_4c = 1.0;
      if ((local_18 == 1) &&
         (fVar5 = (local_38->Style).FramePadding.y, local_48 < fVar5 + fVar5 + local_38->FontSize))
      {
        local_4c = ImSaturate((local_48 - local_38->FontSize) /
                              ((local_38->Style).FramePadding.y * 2.0));
      }
      if (0.0 < local_4c) {
        local_58 = &local_38->Style;
        local_59 = 1.0 <= local_4c;
        local_6c.Min = local_10->Min;
        local_6c.Max = local_10->Max;
        fVar5 = ImClamp<float>((float)(int)((local_44 - 2.0) * 0.5),0.0,3.0);
        fVar5 = -fVar5;
        fVar6 = ImClamp<float>((float)(int)((local_48 - 2.0) * 0.5),0.0,3.0);
        ImVec2::ImVec2(&local_74,fVar5,-fVar6);
        ImRect::Expand(&local_6c,&local_74);
        if (local_18 == 0) {
          fVar6 = ImRect::GetWidth(&local_6c);
        }
        else {
          fVar6 = ImRect::GetHeight(&local_6c);
        }
        fVar11 = fVar6;
        lVar2 = ImMax<long_long>(local_30,local_28);
        bb_00 = (ImRect *)ImMax<long_long>(lVar2,1);
        fVar7 = ImClamp<float>(fVar6 * ((float)local_28 / (float)(long)bb_00),local_58->GrabMinSize,
                               fVar6);
        fVar8 = fVar7 / fVar6;
        bVar13 = 0;
        bVar12 = 0;
        ItemAdd(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,(ImRect *)CONCAT44(fVar5,fVar11)
                ,in_stack_ffffffffffffff04);
        ButtonBehavior(bb_00,(ImGuiID)fVar7,
                       (bool *)CONCAT17(bVar13,CONCAT16(bVar12,in_stack_ffffffffffffff70)),
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
        lVar2 = ImMax<long_long>(1,local_30 - local_28);
        fVar9 = ImSaturate((float)*local_20 / (float)lVar2);
        local_a0 = (fVar9 * (fVar6 - fVar7)) / fVar6;
        if ((((bVar13 & 1) != 0) && ((local_59 & 1) != 0)) && (fVar8 < 1.0)) {
          pfVar3 = ImVec2::operator[](&local_6c.Min,(long)local_18);
          fVar9 = *pfVar3;
          pfVar3 = ImVec2::operator[](&(local_38->IO).MousePos,(long)local_18);
          fVar9 = ImSaturate((*pfVar3 - fVar9) / fVar6);
          if (local_a0 <= fVar9) {
            uVar10 = (uint)(local_a0 + fVar8 < fVar9);
          }
          else {
            uVar10 = 0xffffffff;
          }
          if ((local_38->ActiveIdIsJustActivated & 1U) != 0) {
            local_38->ScrollbarSeekMode = (short)uVar10;
            if (((float)(int)local_38->ScrollbarSeekMode != 0.0) ||
               (NAN((float)(int)local_38->ScrollbarSeekMode))) {
              in_stack_ffffffffffffff00 = 0.0;
            }
            else {
              in_stack_ffffffffffffff00 = -fVar8 * 0.5 + (fVar9 - local_a0);
            }
            local_38->ScrollbarClickDeltaToGrabCenter = in_stack_ffffffffffffff00;
          }
          if (local_38->ScrollbarSeekMode == 0) {
            fVar8 = ImSaturate((-fVar8 * 0.5 + (fVar9 - local_38->ScrollbarClickDeltaToGrabCenter))
                               / (1.0 - fVar8));
            *local_20 = (long)(fVar8 * (float)lVar2);
            in_stack_ffffffffffffff04 = uVar10;
          }
          else {
            in_stack_ffffffffffffff04 = uVar10;
            bVar1 = IsMouseClicked((ImGuiMouseButton)in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffefc,(ImGuiID)in_stack_fffffffffffffef8);
            if ((bVar1) && (uVar10 == (int)local_38->ScrollbarSeekMode)) {
              uVar10 = -(uint)(0.0 < (float)(int)local_38->ScrollbarSeekMode);
              lVar4 = ImClamp<long_long>(*local_20 +
                                         (long)((float)(~uVar10 & 0xbf800000 | uVar10 & 0x3f800000)
                                               * (float)local_28),0,lVar2);
              *local_20 = lVar4;
            }
          }
          fVar8 = ImSaturate((float)*local_20 / (float)lVar2);
          local_a0 = (fVar8 * (fVar6 - fVar7)) / fVar6;
        }
        GetColorU32(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        if ((bVar13 & 1) == 0) {
          fVar6 = 2.10195e-44;
          if ((bVar12 & 1) != 0) {
            fVar6 = 2.24208e-44;
          }
        }
        else {
          fVar6 = 2.38221e-44;
        }
        GetColorU32(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (ImVec2 *)CONCAT44(fVar5,fVar11),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (ImU32)fVar6,in_stack_fffffffffffffef8,(ImDrawFlags)in_stack_fffffffffffffef4);
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        if (local_18 == 0) {
          in_stack_fffffffffffffef8 = ImLerp<float>(local_6c.Min.x,local_6c.Max.x,local_a0);
          in_stack_fffffffffffffef4 = local_6c.Min.y;
          ImLerp<float>(local_6c.Min.x,local_6c.Max.x,local_a0);
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         fVar6,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                         in_stack_fffffffffffffef0);
        }
        else {
          fVar7 = local_6c.Min.x;
          ImLerp<float>(local_6c.Min.y,local_6c.Max.y,local_a0);
          ImLerp<float>(local_6c.Min.y,local_6c.Max.y,local_a0);
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         fVar6,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,fVar7);
        }
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (ImVec2 *)CONCAT44(fVar5,fVar11),
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (ImU32)fVar6,in_stack_fffffffffffffef8,(ImDrawFlags)in_stack_fffffffffffffef4);
        local_1 = (bool)(bVar13 & 1);
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_visible_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_TRUNC((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_TRUNC((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_visible_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_visible_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_visible_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ItemAdd(bb_frame, id, NULL, ImGuiItemFlags_NoNav);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_visible_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);

        const int held_dir = (clicked_v_norm < grab_v_norm) ? -1 : (clicked_v_norm > grab_v_norm + grab_h_norm) ? +1 : 0;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            g.ScrollbarSeekMode = (short)held_dir;
            g.ScrollbarClickDeltaToGrabCenter = (g.ScrollbarSeekMode == 0.0f) ? clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f : 0.0f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        if (g.ScrollbarSeekMode == 0)
        {
            // Absolute seeking
            const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
            *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);
        }
        else
        {
            // Page by page
            if (IsMouseClicked(ImGuiMouseButton_Left, ImGuiInputFlags_Repeat) && held_dir == g.ScrollbarSeekMode)
            {
                float page_dir = (g.ScrollbarSeekMode > 0.0f) ? +1.0f : -1.0f;
                *p_scroll_v = ImClamp(*p_scroll_v + (ImS64)(page_dir * size_visible_v), (ImS64)0, scroll_max);
            }
        }

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seek'ed and saturated
        //if (seek_absolute)
        //    g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}